

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O0

bool __thiscall cmCursesStringWidget::PrintKeys(cmCursesStringWidget *this)

{
  int local_240;
  int local_23c;
  int local_22c;
  undefined1 local_228 [4];
  int i;
  char firstLine [512];
  char fmt_s [3];
  int y;
  int x;
  cmCursesStringWidget *this_local;
  
  if (_stdscr == 0) {
    local_23c = -1;
    local_240 = -1;
  }
  else {
    local_23c = *(short *)(_stdscr + 4) + 1;
    local_240 = *(short *)(_stdscr + 6) + 1;
  }
  if ((local_240 < 0x41) || (local_23c < 6)) {
    this_local._7_1_ = false;
  }
  else if (((this->super_cmCursesWidget).field_0x3c & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    firstLine[0x1fd] = '%';
    firstLine[0x1fe] = 's';
    firstLine[0x1ff] = '\0';
    for (local_22c = 0; local_22c < 0x200; local_22c = local_22c + 1) {
      local_228[local_22c] = 0x20;
    }
    firstLine[0x1f7] = '\0';
    curses_move(local_23c - 4,0);
    printw(firstLine + 0x1fd);
    curses_move(local_23c - 3,0);
    printw(firstLine + 0x1fd);
    curses_move(local_23c - 2,0);
    printw(firstLine + 0x1fd);
    curses_move(local_23c - 1,0);
    printw(firstLine + 0x1fd);
    curses_move(local_23c - 3,0);
    printw(firstLine + 0x1fd,"Editing option, press [enter] to leave edit.");
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCursesStringWidget::PrintKeys()
{
  int x,y;
  getmaxyx(stdscr, y, x);
  if ( x < cmCursesMainForm::MIN_WIDTH  ||
       y < cmCursesMainForm::MIN_HEIGHT )
    {
    return false;
    }
  if (this->InEdit)
    {
    char fmt_s[] = "%s";
    char firstLine[512];
    // Clean the toolbar
    for(int i=0; i<512; i++)
      {
      firstLine[i] = ' ';
      }
    firstLine[511] = '\0';
    curses_move(y-4,0);
    printw(fmt_s, firstLine);
    curses_move(y-3,0);
    printw(fmt_s, firstLine);
    curses_move(y-2,0);
    printw(fmt_s, firstLine);
    curses_move(y-1,0);
    printw(fmt_s, firstLine);

    curses_move(y-3,0);
    printw(fmt_s, "Editing option, press [enter] to leave edit.");
    return true;
    }
  else
    {
    return false;
    }
}